

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_unpack(lua_State *L)

{
  cTValue *pcVar1;
  TValue *pTVar2;
  bool bVar3;
  int iVar4;
  GCtab *t_00;
  cTValue *local_78;
  MSize local_6c;
  cTValue *tv;
  uint32_t nu;
  int32_t e;
  int32_t i;
  int32_t n;
  GCtab *t;
  lua_State *L_local;
  
  t_00 = lj_lib_checktab(L,1);
  nu = lj_lib_optint(L,2,1);
  if ((L->base + 2 < L->top) && (L->base[2].u64 != 0xffffffffffffffff)) {
    local_6c = lj_lib_checkint(L,3);
  }
  else {
    local_6c = lj_tab_len(t_00);
  }
  if ((int)local_6c < (int)nu) {
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = (local_6c - nu) + 1;
    if ((7999 < local_6c - nu) || (iVar4 = lua_checkstack(L,L_local._4_4_), iVar4 == 0)) {
      lj_err_caller(L,LJ_ERR_UNPACK);
    }
    do {
      if (nu < t_00->asize) {
        local_78 = (cTValue *)((t_00->array).ptr64 + (long)(int)nu * 8);
      }
      else {
        local_78 = lj_tab_getinth(t_00,nu);
      }
      if (local_78 == (cTValue *)0x0) {
        pTVar2 = L->top;
        L->top = pTVar2 + 1;
        pTVar2->u64 = 0xffffffffffffffff;
      }
      else {
        pcVar1 = L->top;
        L->top = pcVar1 + 1;
        *pcVar1 = *local_78;
      }
      bVar3 = (int)nu < (int)local_6c;
      nu = nu + 1;
    } while (bVar3);
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(unpack)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = lj_lib_optint(L, 2, 1);
  int32_t e = (L->base+3-1 < L->top && !tvisnil(L->base+3-1)) ?
	      lj_lib_checkint(L, 3) : (int32_t)lj_tab_len(t);
  uint32_t nu;
  if (i > e) return 0;
  nu = (uint32_t)e - (uint32_t)i;
  n = (int32_t)(nu+1);
  if (nu >= LUAI_MAXCSTACK || !lua_checkstack(L, n))
    lj_err_caller(L, LJ_ERR_UNPACK);
  do {
    cTValue *tv = lj_tab_getint(t, i);
    if (tv) {
      copyTV(L, L->top++, tv);
    } else {
      setnilV(L->top++);
    }
  } while (i++ < e);
  return n;
}